

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryPow<Fad<double>,_Fad<double>_>::dx(FadBinaryPow<Fad<double>,_Fad<double>_> *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  undefined8 *in_RDI;
  Fad<double> *this_00;
  double dVar6;
  undefined8 in_stack_ffffffffffffffc8;
  Fad<double> *in_stack_ffffffffffffffd0;
  
  pdVar5 = Fad<double>::dx(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                          );
  dVar1 = *pdVar5;
  pdVar5 = Fad<double>::val((Fad<double> *)*in_RDI);
  this_00 = (Fad<double> *)log(*pdVar5);
  pdVar5 = Fad<double>::val((Fad<double> *)in_RDI[1]);
  dVar2 = *pdVar5;
  pdVar5 = Fad<double>::dx(this_00,(int)((ulong)dVar1 >> 0x20));
  dVar3 = *pdVar5;
  pdVar5 = Fad<double>::val((Fad<double> *)*in_RDI);
  dVar4 = *pdVar5;
  pdVar5 = Fad<double>::val((Fad<double> *)*in_RDI);
  dVar6 = *pdVar5;
  pdVar5 = Fad<double>::val((Fad<double> *)in_RDI[1]);
  dVar6 = pow(dVar6,*pdVar5);
  return (dVar1 * (double)this_00 + (dVar2 * dVar3) / dVar4) * dVar6;
}

Assistant:

const value_type dx(int i) const 
    {
      return  (right_.dx(i)*log(left_.val())+right_.val()*left_.dx(i)/left_.val())
	*pow( left_.val(), right_.val() );
    }